

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImVector<ImGuiWindow_*> *windows;
  ImVector<unsigned_int> *pIVar1;
  ImGuiTabBar *tab_bar;
  int iVar2;
  ImGuiPopupRef *pIVar3;
  undefined8 *puVar4;
  ImGuiTabBar *pIVar5;
  ImGuiWindow *pIVar6;
  ImGuiContext *pIVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  char *pcVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar11;
  undefined8 uVar12;
  long lVar13;
  char *pcVar14;
  ulong uVar15;
  ImDrawList *this;
  long lVar16;
  ImGuiTabItem *tab;
  float fVar17;
  char buf [256];
  ImVec2 local_150;
  undefined1 local_148 [16];
  char local_138 [264];
  
  bVar9 = Begin("ImGui Metrics",p_open,0);
  pIVar7 = GImGui;
  if (bVar9) {
    Text("Dear ImGui %s","1.68 WIP");
    fVar17 = (pIVar7->IO).Framerate;
    Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / fVar17),
         SUB84((double)fVar17,0));
    iVar2 = (pIVar7->IO).MetricsRenderIndices;
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar7->IO).MetricsRenderVertices,
         (long)iVar2,(ulong)(uint)(iVar2 / 3));
    Text("%d active windows (%d visible)",(ulong)(uint)(pIVar7->IO).MetricsActiveWindows,
         (ulong)(uint)(pIVar7->IO).MetricsRenderWindows);
    Text("%d allocations",(ulong)(uint)(pIVar7->IO).MetricsActiveAllocations);
    Checkbox("Show clipping rectangles when hovering draw commands",
             &ShowMetricsWindow::show_draw_cmd_clip_rects);
    Checkbox("Ctrl shows window begin order",&ShowMetricsWindow::show_window_begin_order);
    Separator();
    pIVar7 = GImGui;
    windows = &GImGui->Windows;
    ShowMetricsWindow::Funcs::NodeWindows(windows,"Windows");
    bVar9 = TreeNode("DrawList","Active DrawLists (%d)",
                     (ulong)(uint)(pIVar7->DrawDataBuilder).Layers[0].Size);
    if (bVar9) {
      if (0 < (pIVar7->DrawDataBuilder).Layers[0].Size) {
        lVar13 = 0;
        pcVar11 = extraout_RDX;
        do {
          ShowMetricsWindow::Funcs::NodeDrawList
                    ((ImGuiWindow *)0x0,(pIVar7->DrawDataBuilder).Layers[0].Data[lVar13],pcVar11);
          lVar13 = lVar13 + 1;
          pcVar11 = extraout_RDX_00;
        } while (lVar13 < (pIVar7->DrawDataBuilder).Layers[0].Size);
      }
      TreePop();
    }
    bVar9 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar7->OpenPopupStack).Size);
    if (bVar9) {
      if (0 < (pIVar7->OpenPopupStack).Size) {
        lVar16 = 8;
        lVar13 = 0;
        do {
          pIVar3 = (pIVar7->OpenPopupStack).Data;
          puVar4 = *(undefined8 **)((long)&pIVar3->PopupId + lVar16);
          pcVar11 = "NULL";
          if (puVar4 != (undefined8 *)0x0) {
            pcVar11 = (char *)*puVar4;
          }
          pcVar10 = "";
          if ((puVar4 != (undefined8 *)0x0) &&
             (pcVar10 = " ChildWindow", (*(byte *)((long)puVar4 + 0xf) & 1) == 0)) {
            pcVar10 = "";
          }
          pcVar14 = "";
          if ((puVar4 != (undefined8 *)0x0) &&
             (pcVar14 = " ChildMenu", (*(byte *)((long)puVar4 + 0xf) & 0x10) == 0)) {
            pcVar14 = "";
          }
          BulletText("PopupID: %08x, Window: \'%s\'%s%s",
                     (ulong)*(uint *)((long)pIVar3 + lVar16 + -8),pcVar11,pcVar10,pcVar14);
          lVar13 = lVar13 + 1;
          lVar16 = lVar16 + 0x30;
        } while (lVar13 < (pIVar7->OpenPopupStack).Size);
      }
      TreePop();
    }
    bVar9 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar7->TabBars).Data.Size);
    if (bVar9) {
      if (0 < (pIVar7->TabBars).Data.Size) {
        lVar13 = 0;
        do {
          pIVar5 = (pIVar7->TabBars).Data.Data;
          tab_bar = pIVar5 + lVar13;
          pcVar11 = "";
          if (pIVar5[lVar13].PrevFrameVisible < GImGui->FrameCount + -2) {
            pcVar11 = " *Inactive*";
          }
          ImFormatString(local_138,0x100,"TabBar (%d tabs)%s",(ulong)(uint)pIVar5[lVar13].Tabs.Size,
                         pcVar11);
          bVar9 = TreeNode(tab_bar,"%s",local_138);
          if (bVar9) {
            if (0 < (tab_bar->Tabs).Size) {
              lVar16 = 0;
              uVar15 = 0;
              do {
                tab = (ImGuiTabItem *)((long)&((tab_bar->Tabs).Data)->ID + lVar16);
                PushID(tab);
                bVar9 = SmallButton("<");
                if (bVar9) {
                  TabBarQueueChangeTabOrder(tab_bar,tab,-1);
                }
                pIVar6 = GImGui->CurrentWindow;
                pIVar6->WriteAccessed = true;
                if (pIVar6->SkipItems == false) {
                  fVar17 = (pIVar6->DC).CursorPosPrevLine.y;
                  (pIVar6->DC).CursorPos.x = (pIVar6->DC).CursorPosPrevLine.x + 2.0;
                  (pIVar6->DC).CursorPos.y = fVar17;
                  (pIVar6->DC).CurrentLineSize = (pIVar6->DC).PrevLineSize;
                  (pIVar6->DC).CurrentLineTextBaseOffset = (pIVar6->DC).PrevLineTextBaseOffset;
                }
                bVar9 = SmallButton(">");
                if (bVar9) {
                  TabBarQueueChangeTabOrder(tab_bar,tab,1);
                }
                pIVar8 = GImGui;
                pIVar6 = GImGui->CurrentWindow;
                pIVar6->WriteAccessed = true;
                if (pIVar6->SkipItems == false) {
                  (pIVar6->DC).CursorPos.x =
                       (pIVar8->Style).ItemSpacing.x + (pIVar6->DC).CursorPosPrevLine.x;
                  (pIVar6->DC).CursorPos.y = (pIVar6->DC).CursorPosPrevLine.y;
                  (pIVar6->DC).CurrentLineSize = (pIVar6->DC).PrevLineSize;
                  (pIVar6->DC).CurrentLineTextBaseOffset = (pIVar6->DC).PrevLineTextBaseOffset;
                }
                uVar12 = 0x20;
                if (tab->ID == tab_bar->SelectedTabId) {
                  uVar12 = 0x2a;
                }
                Text("%02d%c Tab 0x%08X",uVar15 & 0xffffffff,uVar12);
                pIVar1 = &GImGui->CurrentWindow->IDStack;
                pIVar1->Size = pIVar1->Size + -1;
                uVar15 = uVar15 + 1;
                lVar16 = lVar16 + 0x1c;
              } while ((long)uVar15 < (long)(tab_bar->Tabs).Size);
            }
            TreePop();
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < (pIVar7->TabBars).Data.Size);
      }
      TreePop();
    }
    bVar9 = TreeNode("Internal state");
    if (bVar9) {
      pcVar10 = "NULL";
      pcVar11 = "NULL";
      if (pIVar7->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar7->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar11);
      pcVar11 = "NULL";
      if (pIVar7->HoveredRootWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar7->HoveredRootWindow->Name;
      }
      Text("HoveredRootWindow: \'%s\'",pcVar11);
      Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",(double)pIVar7->HoveredIdTimer,
           (ulong)pIVar7->HoveredId,(ulong)pIVar7->HoveredIdPreviousFrame,
           (ulong)pIVar7->HoveredIdAllowOverlap);
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           (double)pIVar7->ActiveIdTimer,(ulong)pIVar7->ActiveId,
           (ulong)pIVar7->ActiveIdPreviousFrame,(ulong)pIVar7->ActiveIdAllowOverlap,
           (&PTR_anon_var_dwarf_4eb7b_001e18c0)[pIVar7->ActiveIdSource]);
      pcVar11 = "NULL";
      if (pIVar7->ActiveIdWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar7->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar11);
      pcVar11 = "NULL";
      if (pIVar7->MovingWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar7->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",pcVar11);
      pcVar11 = "NULL";
      if (pIVar7->NavWindow != (ImGuiWindow *)0x0) {
        pcVar11 = pIVar7->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",pcVar11);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar7->NavId,(ulong)pIVar7->NavLayer);
      Text("NavInputSource: %s",(&PTR_anon_var_dwarf_4eb7b_001e18c0)[pIVar7->NavInputSource]);
      Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar7->IO).NavActive,
           (ulong)(pIVar7->IO).NavVisible);
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar7->NavActivateId,
           (ulong)pIVar7->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar7->NavDisableHighlight,
           (ulong)pIVar7->NavDisableMouseHover);
      if (pIVar7->NavWindowingTarget != (ImGuiWindow *)0x0) {
        pcVar10 = pIVar7->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",pcVar10);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)pIVar7->DragDropActive,(ulong)(pIVar7->DragDropPayload).SourceId,
           (pIVar7->DragDropPayload).DataType,(ulong)(uint)(pIVar7->DragDropPayload).DataSize);
      TreePop();
    }
    if ((((pIVar7->IO).KeyCtrl == true) && (ShowMetricsWindow::show_window_begin_order == true)) &&
       (0 < windows->Size)) {
      lVar13 = 0;
      do {
        pIVar6 = (pIVar7->Windows).Data[lVar13];
        if (((pIVar6->Flags & 0x1000000) == 0) && (pIVar6->WasActive == true)) {
          ImFormatString(local_138,0x20,"%d",(ulong)(uint)(int)pIVar6->BeginOrderWithinContext);
          fVar17 = GImGui->FontSize + GImGui->FontSize;
          local_148 = ZEXT416((uint)fVar17);
          this = &GImGui->OverlayDrawList;
          local_150.y = fVar17 + (pIVar6->Pos).y;
          local_150.x = fVar17 + (pIVar6->Pos).x;
          ImDrawList::AddRectFilled(this,&pIVar6->Pos,&local_150,0xff6464c8,0.0,0xf);
          ImDrawList::AddText(this,(ImFont *)0x0,(float)local_148._0_4_,&pIVar6->Pos,0xffffffff,
                              local_138,(char *)0x0,0.0,(ImVec4 *)0x0);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < windows->Size);
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!ImGui::Begin("ImGui Metrics", p_open))
    {
        ImGui::End();
        return;
    }

    static bool show_draw_cmd_clip_rects = true;
    static bool show_window_begin_order = false;
    ImGuiIO& io = ImGui::GetIO();
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    ImGui::Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    ImGui::Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    ImGui::Text("%d allocations", io.MetricsActiveAllocations);
    ImGui::Checkbox("Show clipping rectangles when hovering draw commands", &show_draw_cmd_clip_rects);
    ImGui::Checkbox("Ctrl shows window begin order", &show_window_begin_order);
    ImGui::Separator();

    struct Funcs
    {
        static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImColor(255,100,100), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* overlay_draw_list = GetOverlayDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                overlay_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                if (show_draw_cmd_clip_rects && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); overlay_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                    vtxs_rect.Floor(); overlay_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, vtx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char buf[300];
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, vtx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[vtx_i] : vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, (int)(buf_end - buf_p), "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n", (n == 0) ? "vtx" : "   ", vtx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = overlay_draw_list->Flags;
                            overlay_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            overlay_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            overlay_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }

        static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            for (int i = 0; i < windows.Size; i++)
                Funcs::NodeWindow(windows[i], "Window");
            ImGui::TreePop();
        }

        static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, window->Active || window->WasActive, window))
                return;
            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->SizeContents.x, window->SizeContents.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, GetWindowScrollMaxX(window), window->Scroll.y, GetWindowScrollMaxY(window));
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (Reg %d Resize %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesRegular, window->HiddenFramesForResize, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                {
                    const ImGuiColumnsSet* columns = &window->ColumnsStorage[n];
                    if (ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                    {
                        ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->MaxX - columns->MinX, columns->MinX, columns->MaxX);
                        for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                            ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, OffsetNormToPixels(columns, columns->Columns[column_n].OffsetNorm));
                        ImGui::TreePop();
                    }
                }
                ImGui::TreePop();
            }
            ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.Size * (int)sizeof(ImGuiStorage::Pair));
            ImGui::TreePop();
        }

        static void NodeTabBar(ImGuiTabBar* tab_bar)
        {
            // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernable strings.
            char buf[256];
            char* p = buf;
            const char* buf_end = buf + IM_ARRAYSIZE(buf);
            p += ImFormatString(p, buf_end - p, "TabBar (%d tabs)%s",
                tab_bar->Tabs.Size, (tab_bar->PrevFrameVisible < ImGui::GetFrameCount() - 2) ? " *Inactive*" : "");
            if (ImGui::TreeNode(tab_bar, "%s", buf))
            {
                for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
                {
                    const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                    ImGui::PushID(tab);
                    if (ImGui::SmallButton("<")) { TabBarQueueChangeTabOrder(tab_bar, tab, -1); } ImGui::SameLine(0, 2);
                    if (ImGui::SmallButton(">")) { TabBarQueueChangeTabOrder(tab_bar, tab, +1); } ImGui::SameLine();
                    ImGui::Text("%02d%c Tab 0x%08X", tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID);
                    ImGui::PopID();
                }
                ImGui::TreePop();
            }
        }
    };

    // Access private state, we are going to display the draw lists from last frame
    ImGuiContext& g = *GImGui;
    Funcs::NodeWindows(g.Windows, "Windows");
    if (ImGui::TreeNode("DrawList", "Active DrawLists (%d)", g.DrawDataBuilder.Layers[0].Size))
    {
        for (int i = 0; i < g.DrawDataBuilder.Layers[0].Size; i++)
            Funcs::NodeDrawList(NULL, g.DrawDataBuilder.Layers[0][i], "DrawList");
        ImGui::TreePop();
    }
    if (ImGui::TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            ImGui::BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        ImGui::TreePop();
    }
    if (ImGui::TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.Data.Size))
    {
        for (int n = 0; n < g.TabBars.Data.Size; n++)
            Funcs::NodeTabBar(g.TabBars.GetByIndex(n));
        ImGui::TreePop();
    }
    if (ImGui::TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);
        ImGui::Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        ImGui::Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        ImGui::Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        ImGui::Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        ImGui::Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        ImGui::Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        ImGui::Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        ImGui::Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        ImGui::Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        ImGui::Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        ImGui::Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        ImGui::Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        ImGui::Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        ImGui::Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        ImGui::TreePop();
    }


    if (g.IO.KeyCtrl && show_window_begin_order)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if ((window->Flags & ImGuiWindowFlags_ChildWindow) || !window->WasActive)
                continue;
            char buf[32];
            ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
            float font_size = ImGui::GetFontSize() * 2;
            ImDrawList* overlay_draw_list = GetOverlayDrawList(window);
            overlay_draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
            overlay_draw_list->AddText(NULL, font_size, window->Pos, IM_COL32(255, 255, 255, 255), buf);
        }
    }
    ImGui::End();
}